

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O3

void __thiscall
chrono::ChExceptionArchive::ChExceptionArchive(ChExceptionArchive *this,string *swhat)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (swhat->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + swhat->_M_string_length);
  ChException::ChException(&this->super_ChException,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_ChException = &PTR__ChException_001358f0;
  return;
}

Assistant:

ChExceptionArchive(std::string swhat) : ChException(swhat){}